

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int rebuild_ch_inner_extensions
              (ptls_buffer_t *buf,uint8_t **src,uint8_t *end,uint8_t *outer_ext,
              uint8_t *outer_ext_end)

{
  byte *pbVar1;
  ushort uVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  uint8_t *puVar8;
  long lVar9;
  uint8_t *puVar10;
  ulong uVar11;
  ulong uVar12;
  ushort *puVar13;
  ushort *puVar14;
  size_t sVar15;
  uint8_t *puVar16;
  uint8_t *puVar17;
  size_t sVar18;
  ushort uVar19;
  long lVar20;
  uint8_t *puVar21;
  bool bVar22;
  int local_50;
  
  iVar5 = ptls_buffer_reserve_aligned(buf,2,'\0');
  if (iVar5 == 0) {
    puVar16 = buf->base;
    sVar18 = buf->off;
    (puVar16 + sVar18)[0] = '\0';
    (puVar16 + sVar18)[1] = '\0';
    buf->off = buf->off + 2;
    iVar5 = 0;
  }
  if (iVar5 == 0) {
    sVar18 = buf->off;
    iVar6 = 0x32;
    if ((ulong)((long)end - (long)*src) < 2) {
      bVar22 = false;
    }
    else {
      puVar3 = *src;
      lVar9 = 0;
      puVar16 = (uint8_t *)0x0;
      puVar21 = puVar3;
      do {
        uVar12 = (long)puVar16 * 0x100;
        *src = puVar3 + lVar9 + 1;
        pbVar1 = puVar3 + lVar9;
        puVar16 = (uint8_t *)(uVar12 + *pbVar1);
        puVar21 = puVar21 + 1;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 2);
      bVar22 = false;
      if (puVar16 <= end + (-2 - (long)puVar3)) {
        uVar12 = uVar12 | *pbVar1;
        puVar14 = (ushort *)*src;
        if ((ushort *)(puVar3 + uVar12 + 2) == puVar14) {
          bVar22 = true;
          iVar6 = 0;
        }
        else {
          do {
            iVar6 = 0x32;
            puVar17 = puVar16;
            if (1 < (long)(puVar3 + (uVar12 - (long)puVar14) + 2)) {
              puVar17 = (uint8_t *)(ulong)(ushort)(*puVar14 << 8 | *puVar14 >> 8);
              *src = (uint8_t *)(puVar14 + 1);
              iVar6 = 0;
            }
            puVar16 = puVar17;
            local_50 = 6;
            if ((long)(puVar3 + (uVar12 - (long)puVar14) + 2) < 2) goto LAB_0011cc21;
            iVar6 = 0x32;
            if (puVar3 + (uVar12 - (long)*src) + 2 < (uint8_t *)0x2) {
LAB_0011cc1c:
              local_50 = 6;
            }
            else {
              puVar4 = *src;
              lVar9 = 0;
              puVar8 = (uint8_t *)0x0;
              do {
                lVar20 = (long)puVar8 * 0x100;
                *src = puVar4 + lVar9 + 1;
                uVar7 = (ulong)puVar4[lVar9];
                puVar8 = (uint8_t *)(lVar20 + uVar7);
                lVar9 = lVar9 + 1;
              } while (lVar9 != 2);
              if (puVar21 + (uVar12 - (long)puVar4) + -2 < puVar8) goto LAB_0011cc1c;
              puVar10 = puVar4 + lVar20 + uVar7 + 2;
              if (((uint)puVar17 & 0xffff) == 0xfd00) {
                iVar6 = 0x32;
                if (puVar8 == (uint8_t *)0x0) {
                  local_50 = 6;
                }
                else {
                  *src = puVar4 + 3;
                  uVar7 = (ulong)puVar4[2];
                  if ((ulong)((long)puVar10 - (long)(puVar4 + 3)) < uVar7) {
                    local_50 = 6;
                  }
                  else {
                    puVar14 = (ushort *)outer_ext;
                    do {
                      puVar13 = (ushort *)*src;
                      iVar6 = 0x32;
                      outer_ext = (uint8_t *)puVar14;
                      if (1 < (long)(puVar4 + (uVar7 - (long)puVar13) + 3)) {
                        uVar2 = *puVar13;
                        uVar19 = uVar2 << 8 | uVar2 >> 8;
                        *src = (uint8_t *)(puVar13 + 1);
                        iVar6 = 0x2f;
                        if (uVar19 != 0xfe0d) {
                          while (outer_ext = (uint8_t *)puVar14,
                                1 < (long)outer_ext_end - (long)puVar14) {
                            puVar13 = puVar14 + 1;
                            outer_ext = (uint8_t *)puVar13;
                            if ((long)outer_ext_end - (long)puVar13 < 2) break;
                            outer_ext = (uint8_t *)(puVar14 + 2);
                            uVar11 = (ulong)(ushort)(*puVar13 << 8 | *puVar13 >> 8);
                            if ((long)outer_ext_end - (long)outer_ext < (long)uVar11) {
                              __assert_fail("outer_ext_end - outer_ext >= outersize",
                                            "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                                            ,0xf63,
                                            "int rebuild_ch_inner_extensions(ptls_buffer_t *, const uint8_t **, const uint8_t *const, const uint8_t *, const uint8_t *)"
                                           );
                            }
                            if ((ushort)(*puVar14 << 8 | *puVar14 >> 8) == uVar19) {
                              iVar6 = ptls_buffer_reserve_aligned(buf,2,'\0');
                              if (iVar6 == 0) {
                                *(ushort *)(buf->base + buf->off) = (uVar2 >> 8) << 8 | uVar2 & 0xff
                                ;
                                buf->off = buf->off + 2;
                                iVar6 = 0;
                              }
                              local_50 = 6;
                              if (iVar6 == 0) {
                                local_50 = 0;
                              }
                              puVar16 = (uint8_t *)((ulong)puVar17 & 0xffff);
                              if (iVar6 != 0) goto LAB_0011cf94;
                              iVar6 = ptls_buffer_reserve_aligned(buf,2,'\0');
                              if (iVar6 == 0) {
                                puVar16 = buf->base;
                                sVar15 = buf->off;
                                (puVar16 + sVar15)[0] = '\0';
                                (puVar16 + sVar15)[1] = '\0';
                                buf->off = buf->off + 2;
                                iVar6 = 0;
                              }
                              puVar16 = (uint8_t *)((ulong)puVar17 & 0xffff);
                              if (iVar6 == 0) {
                                sVar15 = buf->off;
                                iVar6 = ptls_buffer__do_pushv(buf,outer_ext,uVar11);
                                if (iVar6 == 0) {
                                  outer_ext = (uint8_t *)((long)outer_ext + uVar11);
                                  uVar11 = buf->off - sVar15;
                                  iVar6 = 0x20c;
                                  local_50 = 6;
                                  if (uVar11 < 0x10000) {
                                    lVar9 = 8;
                                    do {
                                      buf->base[sVar15 - 2] =
                                           (uint8_t)(uVar11 >> ((byte)lVar9 & 0x3f));
                                      lVar9 = lVar9 + -8;
                                      sVar15 = sVar15 + 1;
                                    } while (lVar9 != -8);
                                    iVar6 = 0;
                                    puVar16 = (uint8_t *)((ulong)puVar17 & 0xffff);
                                    local_50 = 0;
                                  }
                                  else {
                                    puVar16 = (uint8_t *)((ulong)puVar17 & 0xffff);
                                  }
                                  goto LAB_0011cf94;
                                }
                                puVar16 = (uint8_t *)((ulong)puVar17 & 0xffff);
                              }
                              break;
                            }
                            puVar14 = (ushort *)((long)outer_ext + uVar11);
                          }
                        }
                      }
                      local_50 = 6;
LAB_0011cf94:
                      if (local_50 != 0) goto LAB_0011d042;
                      puVar14 = (ushort *)outer_ext;
                    } while (puVar4 + uVar7 + 3 != *src);
                    local_50 = 0;
                  }
                }
LAB_0011d042:
                if (local_50 == 0) {
LAB_0011d13c:
                  local_50 = 0;
                  if (puVar10 != *src) {
                    iVar6 = 0x32;
                    local_50 = 6;
                  }
                }
              }
              else {
                iVar6 = ptls_buffer_reserve_aligned(buf,2,'\0');
                puVar16 = (uint8_t *)((ulong)puVar17 & 0xffff);
                if (iVar6 == 0) {
                  *(ushort *)(buf->base + buf->off) = (ushort)puVar17 << 8 | (ushort)puVar17 >> 8;
                  buf->off = buf->off + 2;
                  iVar6 = 0;
                }
                local_50 = 6;
                if (iVar6 == 0) {
                  iVar6 = ptls_buffer_reserve_aligned(buf,2,'\0');
                  if (iVar6 == 0) {
                    puVar16 = buf->base;
                    sVar15 = buf->off;
                    (puVar16 + sVar15)[0] = '\0';
                    (puVar16 + sVar15)[1] = '\0';
                    buf->off = buf->off + 2;
                    iVar6 = 0;
                  }
                  local_50 = 6;
                  if (iVar6 == 0) {
                    sVar15 = buf->off;
                    iVar6 = ptls_buffer__do_pushv
                                      (buf,*src,(size_t)(puVar4 + (lVar20 - (long)*src) + uVar7 + 2)
                                      );
                    if (iVar6 == 0) {
                      *src = puVar10;
                      uVar7 = buf->off - sVar15;
                      if (uVar7 < 0x10000) {
                        lVar9 = 8;
                        do {
                          buf->base[sVar15 - 2] = (uint8_t)(uVar7 >> ((byte)lVar9 & 0x3f));
                          lVar9 = lVar9 + -8;
                          sVar15 = sVar15 + 1;
                        } while (lVar9 != -8);
                        local_50 = 0;
                        bVar22 = true;
                        iVar6 = 0;
                      }
                      else {
                        iVar6 = 0x20c;
                        bVar22 = false;
                      }
                    }
                    else {
                      bVar22 = false;
                      local_50 = 6;
                    }
                  }
                  else {
                    bVar22 = false;
                    local_50 = 6;
                  }
                  puVar16 = (uint8_t *)((ulong)puVar17 & 0xffff);
                  if (bVar22) goto LAB_0011d13c;
                }
              }
            }
LAB_0011cc21:
            bVar22 = local_50 == 0;
          } while ((bVar22) &&
                  (puVar14 = (ushort *)*src, (ushort *)(puVar3 + uVar12 + 2) != puVar14));
        }
      }
    }
    iVar5 = iVar6;
    if (bVar22) {
      uVar12 = buf->off - sVar18;
      iVar5 = 0x20c;
      if (uVar12 < 0x10000) {
        lVar9 = 8;
        do {
          buf->base[sVar18 - 2] = (uint8_t)(uVar12 >> ((byte)lVar9 & 0x3f));
          lVar9 = lVar9 + -8;
          sVar18 = sVar18 + 1;
          iVar5 = iVar6;
        } while (lVar9 != -8);
      }
    }
  }
  return iVar5;
}

Assistant:

static int rebuild_ch_inner_extensions(ptls_buffer_t *buf, const uint8_t **src, const uint8_t *const end, const uint8_t *outer_ext,
                                       const uint8_t *outer_ext_end)
{
    int ret;

    ptls_buffer_push_block(buf, 2, {
        ptls_decode_open_block(*src, end, 2, {
            while (*src != end) {
                uint16_t exttype;
                if ((ret = ptls_decode16(&exttype, src, end)) != 0)
                    goto Exit;
                ptls_decode_open_block(*src, end, 2, {
                    if (exttype == PTLS_EXTENSION_TYPE_ECH_OUTER_EXTENSIONS) {
                        ptls_decode_open_block(*src, end, 1, {
                            do {
                                uint16_t reftype;
                                uint16_t outertype;
                                uint16_t outersize;
                                if ((ret = ptls_decode16(&reftype, src, end)) != 0)
                                    goto Exit;
                                if (reftype == PTLS_EXTENSION_TYPE_ENCRYPTED_CLIENT_HELLO) {
                                    ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                                    goto Exit;
                                }
                                while (1) {
                                    if (ptls_decode16(&outertype, &outer_ext, outer_ext_end) != 0 ||
                                        ptls_decode16(&outersize, &outer_ext, outer_ext_end) != 0) {
                                        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                                        goto Exit;
                                    }
                                    assert(outer_ext_end - outer_ext >= outersize);
                                    if (outertype == reftype)
                                        break;
                                    outer_ext += outersize;
                                }
                                buffer_push_extension(buf, reftype, {
                                    ptls_buffer_pushv(buf, outer_ext, outersize);
                                    outer_ext += outersize;
                                });
                            } while (*src != end);
                        });
                    } else {
                        buffer_push_extension(buf, exttype, {
                            ptls_buffer_pushv(buf, *src, end - *src);
                            *src = end;
                        });
                    }
                });
            }
        });
    });

Exit:
    return ret;
}